

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string *local_40;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  string *loaderPath_local;
  string *executablePath_local;
  string *name_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  *resolved = false;
  local_40 = path;
  path_local = (string *)rpaths;
  rpaths_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)loaderPath;
  loaderPath_local = executablePath;
  executablePath_local = name;
  name_local = (string *)this;
  local_50 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
  bVar1 = cmHasLiteralPrefix<8ul>(local_50,(char (*) [8])"@rpath/");
  if (bVar1) {
    bVar1 = ResolveRPathDependency
                      (this,executablePath_local,loaderPath_local,(string *)rpaths_local,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)path_local,local_40,resolved);
    if (!bVar1) {
      return false;
    }
  }
  else {
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)executablePath_local);
    bVar1 = cmHasLiteralPrefix<14ul>(local_60,(char (*) [14])"@loader_path/");
    if (bVar1) {
      bVar1 = ResolveLoaderPathDependency
                        (this,executablePath_local,(string *)rpaths_local,local_40,resolved);
      if (!bVar1) {
        return false;
      }
    }
    else {
      local_70 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)executablePath_local);
      bVar1 = cmHasLiteralPrefix<18ul>(local_70,(char (*) [18])"@executable_path/");
      if (bVar1) {
        bVar1 = ResolveExecutablePathDependency
                          (this,executablePath_local,loaderPath_local,local_40,resolved);
        if (!bVar1) {
          return false;
        }
      }
      else {
        *resolved = true;
        std::__cxx11::string::operator=((string *)local_40,(string *)executablePath_local);
      }
    }
  }
  if ((*resolved & 1U) != 0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(local_40);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Resolved path is not absolute",&local_91);
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      return false;
    }
  }
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  resolved = false;
  if (cmHasLiteralPrefix(name, "@rpath/")) {
    if (!this->ResolveRPathDependency(name, executablePath, loaderPath, rpaths,
                                      path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@loader_path/")) {
    if (!this->ResolveLoaderPathDependency(name, loaderPath, path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@executable_path/")) {
    if (!this->ResolveExecutablePathDependency(name, executablePath, path,
                                               resolved)) {
      return false;
    }
  } else {
    resolved = true;
    path = name;
  }

  if (resolved && !cmSystemTools::FileIsFullPath(path)) {
    this->SetError("Resolved path is not absolute");
    return false;
  }

  return true;
}